

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_noise_estimate.c
# Opt level: O3

void av1_update_noise_estimate(AV1_COMP *cpi)

{
  YV12_BUFFER_CONFIG *pYVar1;
  uint8_t *puVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  byte bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int *piVar11;
  NOISE_LEVEL NVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int iVar17;
  long lVar18;
  ulong uVar19;
  byte *pbVar20;
  long lVar21;
  uint uVar22;
  int iVar23;
  uint8_t *puVar24;
  uint8_t *puVar25;
  bool bVar26;
  uint hist_avg [20];
  undefined8 local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  uint local_88 [22];
  int iVar16;
  
  iVar10 = (cpi->common).width;
  iVar7 = 0x28;
  if ((iVar10 < 0x161) && (iVar7 = 0x28, (cpi->common).height < 0x121)) {
    iVar7 = 0x3c;
  }
  iVar15 = (cpi->resize_pending_params).width;
  bVar3 = true;
  bVar26 = true;
  if (iVar15 != 0) {
    iVar16 = (cpi->resize_pending_params).height;
    bVar26 = true;
    if (iVar16 != 0) {
      if (iVar10 == iVar15) {
        bVar26 = (cpi->common).height == iVar16;
      }
      else {
        bVar26 = false;
      }
    }
  }
  iVar15 = 0;
  iVar16 = 0;
  if ((((((((cpi->common).seq_params)->use_highbitdepth == '\0') &&
         ((cpi->oxcf).pass == AOM_RC_ONE_PASS)) && ((cpi->oxcf).rc_cfg.mode == AOM_CBR)) &&
       ((iVar15 = iVar16, (cpi->oxcf).q_cfg.aq_mode == '\x03' &&
        ((bool)(4 < (cpi->oxcf).speed & bVar26))))) && (cpi->ppi->use_svc == 0)) &&
     (((cpi->oxcf).tune_cfg.content != AOM_CONTENT_SCREEN &&
      (0x383ff < (cpi->common).height * iVar10)))) {
    iVar15 = 1;
    bVar3 = false;
  }
  uVar22 = (cpi->common).current_frame.frame_number;
  pYVar1 = cpi->last_source;
  (cpi->noise_estimate).enabled = iVar15;
  iVar15 = (cpi->svc).number_spatial_layers;
  if (1 < iVar15) {
    uVar22 = (cpi->svc).current_superframe;
  }
  if ((bVar3) || (pYVar1 == (YV12_BUFFER_CONFIG *)0x0 || (uVar22 & 7) != 0)) {
    if (pYVar1 == (YV12_BUFFER_CONFIG *)0x0) {
      return;
    }
LAB_00254558:
    (cpi->noise_estimate).last_w = iVar10;
    (cpi->noise_estimate).last_h = (cpi->common).height;
    return;
  }
  if ((iVar15 == 1) &&
     (((cpi->noise_estimate).last_w != iVar10 ||
      ((cpi->noise_estimate).last_h != (cpi->common).height)))) goto LAB_00254558;
  if ((((0x3c < (int)uVar22) && (1 < (cpi->svc).num_encoded_top_layer)) &&
      (iVar15 < (cpi->rc).frames_since_key)) &&
     (((cpi->svc).spatial_layer_id == iVar15 + -1 && ((cpi->rc).avg_frame_low_motion < iVar7)))) {
    (cpi->noise_estimate).level = kLowLow;
    (cpi->noise_estimate).count = 0;
    (cpi->noise_estimate).num_frames_estimate = 10;
    return;
  }
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  local_c8 = (undefined1  [16])0x0;
  local_d8 = (undefined1  [16])0x0;
  iVar7 = (cpi->common).mi_params.mi_rows;
  uVar13 = (ulong)iVar7;
  if ((long)uVar13 < 1) {
LAB_0025484e:
    (cpi->noise_estimate).last_w = iVar10;
    (cpi->noise_estimate).last_h = (cpi->common).height;
    local_d8._0_4_ = 0;
  }
  else {
    puVar24 = (cpi->source->field_5).buffers[0];
    iVar15 = (cpi->source->field_4).field_0.y_stride;
    puVar25 = (pYVar1->field_5).buffers[0];
    iVar16 = (pYVar1->field_4).field_0.y_stride;
    iVar14 = (cpi->common).mi_params.mi_cols;
    lVar18 = 0;
    uVar19 = 0;
    iVar23 = 0;
    do {
      if (0 < iVar14) {
        pbVar20 = cpi->consec_zero_mv + lVar18;
        lVar21 = 0;
        do {
          iVar23 = (iVar23 + 1) - (uint)(*pbVar20 < 3);
          lVar21 = lVar21 + 2;
          pbVar20 = pbVar20 + 1;
        } while (lVar21 < iVar14);
      }
      uVar19 = uVar19 + 2;
      lVar18 = lVar18 + (iVar14 >> 1);
    } while (uVar19 < uVar13);
    if (iVar7 < 1) goto LAB_0025484e;
    iVar7 = iVar7 * iVar14;
    uVar22 = 0;
    iVar10 = iVar14;
    local_e0 = cpi;
    do {
      if (0 < iVar10) {
        uVar13 = 0;
        do {
          uVar9 = (uint)uVar13;
          if (((((uVar9 | uVar22) & 7) == 0) && ((int)uVar22 < (cpi->common).mi_params.mi_rows + -3)
              ) && ((int)uVar9 < iVar10 + -3)) {
            iVar17 = (int)(uVar13 >> 1) + (iVar10 >> 1) * (uVar22 >> 1);
            puVar2 = cpi->consec_zero_mv;
            lVar18 = (long)((iVar10 >> 1) + iVar17);
            bVar6 = puVar2[lVar18 + 1];
            if (puVar2[lVar18] < puVar2[lVar18 + 1]) {
              bVar6 = puVar2[lVar18];
            }
            if (puVar2[(long)iVar17 + 1] < bVar6) {
              bVar6 = puVar2[(long)iVar17 + 1];
            }
            if (puVar2[iVar17] <= bVar6) {
              bVar6 = puVar2[iVar17];
            }
            if (((iVar7 * 3 >> 5 <= iVar23) && (2 < bVar6)) && ((cpi->rc).high_source_sad == 0)) {
              uVar8 = (*cpi->ppi->fn_ptr[6].vf)(puVar24,iVar15,puVar25,iVar16,local_88);
              if (uVar8 < 2000) {
                piVar11 = (int *)(local_d8 + (ulong)((uVar8 & 0xffff) / 100) * 4);
LAB_00254795:
                *piVar11 = *piVar11 + 1;
              }
              else {
                piVar11 = (int *)(local_98 + 0xc);
                if (uVar8 < 3000) goto LAB_00254795;
              }
              iVar14 = (local_e0->common).mi_params.mi_cols;
              cpi = local_e0;
            }
          }
          puVar24 = puVar24 + 4;
          puVar25 = puVar25 + 4;
          uVar13 = (ulong)(uVar9 + 1);
          iVar10 = iVar14;
        } while ((int)(uVar9 + 1) < iVar14);
        uVar13 = (ulong)(uint)(cpi->common).mi_params.mi_rows;
      }
      auVar5 = local_c8;
      puVar24 = puVar24 + (iVar15 - iVar10) * 4;
      puVar25 = puVar25 + (iVar16 - iVar10) * 4;
      uVar22 = uVar22 + 1;
    } while ((int)uVar22 < (int)uVar13);
    iVar10 = (cpi->common).height;
    (cpi->noise_estimate).last_w = (cpi->common).width;
    (cpi->noise_estimate).last_h = iVar10;
    if (10 < (uint)local_d8._0_4_) {
      uVar22 = local_d8._0_4_;
      uVar9 = local_98._12_4_;
      if ((uint)local_d8._0_4_ >> 2 < (uint)local_98._12_4_) {
        auVar4._4_4_ = local_d8._8_4_ >> 2;
        auVar4._0_4_ = local_d8._4_4_ >> 2;
        auVar4._8_4_ = (uint)local_d8._12_4_ >> 2;
        auVar4._12_4_ = 0;
        local_d8 = auVar4 << 0x20;
        uVar22 = local_c8._0_4_;
        local_c8._4_4_ = local_c8._4_4_ >> 1;
        local_c8._0_4_ = uVar22 >> 1;
        local_c8._8_4_ = auVar5._8_4_;
        local_c8._12_4_ = auVar5._12_4_;
        local_c8._8_4_ = (uint)(local_c8._8_4_ * 3) >> 1;
        uVar9 = (uint)local_98._12_4_ >> 1;
        local_98._12_4_ = uVar9;
        uVar22 = 0;
      }
      goto LAB_00254869;
    }
  }
  uVar22 = local_d8._0_4_;
  uVar9 = local_98._12_4_;
LAB_00254869:
  uVar19 = 0;
  uVar13 = 0;
  uVar8 = 0;
  do {
    iVar10 = (int)uVar19;
    if (iVar10 == 0x13) {
      local_88[0x13] = uVar9 >> 2;
    }
    else if (iVar10 == 0x12) {
      local_88[0x12] = local_98._8_4_ * 2 + local_98._4_4_ + (uVar9 >> 1) + 2 >> 2;
    }
    else if (iVar10 == 0) {
      local_88[0] = (uVar22 + local_d8._4_4_ + local_d8._8_4_) / 3;
    }
    else {
      local_88[uVar19] =
           *(int *)(local_d8 + uVar19 * 4) * 2 + *(int *)(local_d8 + uVar19 * 4 + -4) +
           *(int *)(local_d8 + uVar19 * 4 + 4) + 2U >> 2;
    }
    if (uVar8 < local_88[uVar19]) {
      uVar13 = uVar19 & 0xffffffff;
      uVar8 = local_88[uVar19];
    }
    uVar19 = uVar19 + 1;
  } while (uVar19 != 0x14);
  uVar22 = (uint)((cpi->noise_estimate).value * 3 + (int)uVar13 * 0x28) >> 2;
  (cpi->noise_estimate).value = uVar22;
  if ((((cpi->noise_estimate).level < kMedium) && ((cpi->noise_estimate).adapt_thresh < (int)uVar22)
      ) || (iVar10 = (cpi->noise_estimate).count + 1, (cpi->noise_estimate).count = iVar10,
           iVar10 == (cpi->noise_estimate).num_frames_estimate)) {
    (cpi->noise_estimate).num_frames_estimate = 0x1e;
    (cpi->noise_estimate).count = 0;
    uVar9 = (cpi->noise_estimate).thresh;
    NVar12 = kHigh;
    if ((uVar22 == uVar9 * 2 || SBORROW4(uVar22,uVar9 * 2) != (int)(uVar22 + uVar9 * -2) < 0) &&
       (NVar12 = kMedium, (int)uVar22 <= (int)uVar9)) {
      NVar12 = (NOISE_LEVEL)(uVar9 >> 1 < uVar22);
    }
    (cpi->noise_estimate).level = NVar12;
  }
  return;
}

Assistant:

void av1_update_noise_estimate(AV1_COMP *const cpi) {
  const AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;

  NOISE_ESTIMATE *const ne = &cpi->noise_estimate;
  const int low_res = (cm->width <= 352 && cm->height <= 288);
  // Estimate of noise level every frame_period frames.
  int frame_period = 8;
  int thresh_consec_zeromv = 2;
  int frame_counter = cm->current_frame.frame_number;
  // Estimate is between current source and last source.
  YV12_BUFFER_CONFIG *last_source = cpi->last_source;
#if CONFIG_AV1_TEMPORAL_DENOISING
  if (cpi->oxcf.noise_sensitivity > 0 && noise_est_svc(cpi)) {
    last_source = &cpi->denoiser.last_source;
    // Tune these thresholds for different resolutions when denoising is
    // enabled.
    if (cm->width > 640 && cm->width <= 1920) {
      thresh_consec_zeromv = 2;
    }
  }
#endif
  ne->enabled = enable_noise_estimation(cpi);
  if (cpi->svc.number_spatial_layers > 1)
    frame_counter = cpi->svc.current_superframe;
  if (!ne->enabled || frame_counter % frame_period != 0 ||
      last_source == NULL ||
      (cpi->svc.number_spatial_layers == 1 &&
       (ne->last_w != cm->width || ne->last_h != cm->height))) {
#if CONFIG_AV1_TEMPORAL_DENOISING
    if (cpi->oxcf.noise_sensitivity > 0 && noise_est_svc(cpi))
      copy_frame(&cpi->denoiser.last_source, cpi->source);
#endif
    if (last_source != NULL) {
      ne->last_w = cm->width;
      ne->last_h = cm->height;
    }
    return;
  } else if (frame_counter > 60 && cpi->svc.num_encoded_top_layer > 1 &&
             cpi->rc.frames_since_key > cpi->svc.number_spatial_layers &&
             cpi->svc.spatial_layer_id == cpi->svc.number_spatial_layers - 1 &&
             cpi->rc.avg_frame_low_motion < (low_res ? 60 : 40)) {
    // Force noise estimation to 0 and denoiser off if content has high motion.
    ne->level = kLowLow;
    ne->count = 0;
    ne->num_frames_estimate = 10;
#if CONFIG_AV1_TEMPORAL_DENOISING
    if (cpi->oxcf.noise_sensitivity > 0 && noise_est_svc(cpi) &&
        cpi->svc.current_superframe > 1) {
      av1_denoiser_set_noise_level(cpi, ne->level);
      copy_frame(&cpi->denoiser.last_source, cpi->source);
    }
#endif
    return;
  } else {
    unsigned int bin_size = 100;
    unsigned int hist[MAX_VAR_HIST_BINS] = { 0 };
    unsigned int hist_avg[MAX_VAR_HIST_BINS];
    unsigned int max_bin = 0;
    unsigned int max_bin_count = 0;
    unsigned int bin_cnt;
    BLOCK_SIZE bsize = BLOCK_16X16;
    // Loop over sub-sample of 16x16 blocks of frame, and for blocks that have
    // been encoded as zero/small mv at least x consecutive frames, compute
    // the variance to update estimate of noise in the source.
    const uint8_t *src_y = cpi->source->y_buffer;
    const int src_ystride = cpi->source->y_stride;
    const uint8_t *last_src_y = last_source->y_buffer;
    const int last_src_ystride = last_source->y_stride;
    int mi_row, mi_col;
    int num_low_motion = 0;
    int frame_low_motion = 1;
    for (mi_row = 0; mi_row < mi_params->mi_rows; mi_row += 2) {
      for (mi_col = 0; mi_col < mi_params->mi_cols; mi_col += 2) {
        int bl_index =
            (mi_row >> 1) * (mi_params->mi_cols >> 1) + (mi_col >> 1);
        if (cpi->consec_zero_mv[bl_index] > thresh_consec_zeromv)
          num_low_motion++;
      }
    }
    if (num_low_motion <
        (((3 * (mi_params->mi_rows * mi_params->mi_cols) >> 2)) >> 3))
      frame_low_motion = 0;
    for (mi_row = 0; mi_row < mi_params->mi_rows; mi_row++) {
      for (mi_col = 0; mi_col < mi_params->mi_cols; mi_col++) {
        // 16x16 blocks, 1/4 sample of frame.
        if (mi_row % 8 == 0 && mi_col % 8 == 0 &&
            mi_row < mi_params->mi_rows - 3 &&
            mi_col < mi_params->mi_cols - 3) {
          int bl_index =
              (mi_row >> 1) * (mi_params->mi_cols >> 1) + (mi_col >> 1);
          int bl_index1 = bl_index + 1;
          int bl_index2 = bl_index + (mi_params->mi_cols >> 1);
          int bl_index3 = bl_index2 + 1;
          int consec_zeromv =
              AOMMIN(cpi->consec_zero_mv[bl_index],
                     AOMMIN(cpi->consec_zero_mv[bl_index1],
                            AOMMIN(cpi->consec_zero_mv[bl_index2],
                                   cpi->consec_zero_mv[bl_index3])));
          // Only consider blocks that are likely steady background. i.e, have
          // been encoded as zero/low motion x (= thresh_consec_zeromv) frames
          // in a row. consec_zero_mv[] defined for 8x8 blocks, so consider all
          // 4 sub-blocks for 16x16 block. And exclude this frame if
          // high_source_sad is true (i.e., scene/content change).
          if (frame_low_motion && consec_zeromv > thresh_consec_zeromv &&
              !cpi->rc.high_source_sad) {
            unsigned int sse;
            // Compute variance between co-located blocks from current and
            // last input frames.
            unsigned int variance = cpi->ppi->fn_ptr[bsize].vf(
                src_y, src_ystride, last_src_y, last_src_ystride, &sse);
            unsigned int hist_index = variance / bin_size;
            if (hist_index < MAX_VAR_HIST_BINS)
              hist[hist_index]++;
            else if (hist_index < 3 * (MAX_VAR_HIST_BINS >> 1))
              hist[MAX_VAR_HIST_BINS - 1]++;  // Account for the tail
          }
        }
        src_y += 4;
        last_src_y += 4;
      }
      src_y += (src_ystride << 2) - (mi_params->mi_cols << 2);
      last_src_y += (last_src_ystride << 2) - (mi_params->mi_cols << 2);
    }
    ne->last_w = cm->width;
    ne->last_h = cm->height;
    // Adjust histogram to account for effect that histogram flattens
    // and shifts to zero as scene darkens.
    if (hist[0] > 10 && (hist[MAX_VAR_HIST_BINS - 1] > hist[0] >> 2)) {
      hist[0] = 0;
      hist[1] >>= 2;
      hist[2] >>= 2;
      hist[3] >>= 2;
      hist[4] >>= 1;
      hist[5] >>= 1;
      hist[6] = 3 * hist[6] >> 1;
      hist[MAX_VAR_HIST_BINS - 1] >>= 1;
    }

    // Average hist[] and find largest bin
    for (bin_cnt = 0; bin_cnt < MAX_VAR_HIST_BINS; bin_cnt++) {
      if (bin_cnt == 0)
        hist_avg[bin_cnt] = (hist[0] + hist[1] + hist[2]) / 3;
      else if (bin_cnt == MAX_VAR_HIST_BINS - 1)
        hist_avg[bin_cnt] = hist[MAX_VAR_HIST_BINS - 1] >> 2;
      else if (bin_cnt == MAX_VAR_HIST_BINS - 2)
        hist_avg[bin_cnt] = (hist[bin_cnt - 1] + 2 * hist[bin_cnt] +
                             (hist[bin_cnt + 1] >> 1) + 2) >>
                            2;
      else
        hist_avg[bin_cnt] =
            (hist[bin_cnt - 1] + 2 * hist[bin_cnt] + hist[bin_cnt + 1] + 2) >>
            2;

      if (hist_avg[bin_cnt] > max_bin_count) {
        max_bin_count = hist_avg[bin_cnt];
        max_bin = bin_cnt;
      }
    }
    // Scale by 40 to work with existing thresholds
    ne->value = (int)((3 * ne->value + max_bin * 40) >> 2);
    // Quickly increase VNR strength when the noise level increases suddenly.
    if (ne->level < kMedium && ne->value > ne->adapt_thresh) {
      ne->count = ne->num_frames_estimate;
    } else {
      ne->count++;
    }
    if (ne->count == ne->num_frames_estimate) {
      // Reset counter and check noise level condition.
      ne->num_frames_estimate = 30;
      ne->count = 0;
      ne->level = av1_noise_estimate_extract_level(ne);
#if CONFIG_AV1_TEMPORAL_DENOISING
      if (cpi->oxcf.noise_sensitivity > 0 && noise_est_svc(cpi))
        av1_denoiser_set_noise_level(cpi, ne->level);
#endif
    }
  }
#if CONFIG_AV1_TEMPORAL_DENOISING
  if (cpi->oxcf.noise_sensitivity > 0 && noise_est_svc(cpi))
    copy_frame(&cpi->denoiser.last_source, cpi->source);
#endif
}